

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

void google::protobuf::compiler::protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::TableStruct
     ::Shutdown(void)

{
  if (DAT_0042fc50 == '\x01') {
    DAT_0042fc50 = '\0';
    (*(code *)*_Version_default_instance_)(&_Version_default_instance_);
  }
  if (DAT_0042fd38 != (long *)0x0) {
    (**(code **)(*DAT_0042fd38 + 8))();
  }
  if (DAT_0042fcb0 == '\x01') {
    DAT_0042fcb0 = '\0';
    (*(code *)*_CodeGeneratorRequest_default_instance_)(&_CodeGeneratorRequest_default_instance_);
  }
  if (DAT_0042fd48 != (long *)0x0) {
    (**(code **)(*DAT_0042fd48 + 8))();
  }
  if (DAT_0042fce8 == '\x01') {
    DAT_0042fce8 = '\0';
    (*(code *)*_CodeGeneratorResponse_File_default_instance_)
              (&_CodeGeneratorResponse_File_default_instance_);
  }
  if (DAT_0042fd58 != (long *)0x0) {
    (**(code **)(*DAT_0042fd58 + 8))();
  }
  if (DAT_0042fd28 == '\x01') {
    DAT_0042fd28 = '\0';
    (*(code *)*_CodeGeneratorResponse_default_instance_)(&_CodeGeneratorResponse_default_instance_);
  }
  if (DAT_0042fd68 != (long *)0x0) {
    (**(code **)(*DAT_0042fd68 + 8))();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Version_default_instance_.Shutdown();
  delete file_level_metadata[0].reflection;
  _CodeGeneratorRequest_default_instance_.Shutdown();
  delete file_level_metadata[1].reflection;
  _CodeGeneratorResponse_File_default_instance_.Shutdown();
  delete file_level_metadata[2].reflection;
  _CodeGeneratorResponse_default_instance_.Shutdown();
  delete file_level_metadata[3].reflection;
}